

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

Mio_Gate_t **
Mio_CollectRoots(Mio_Library_t *pLib,int nInputs,float tDelay,int fSkipInv,int *pnGates,int fVerbose
                )

{
  word wVar1;
  Mio_Gate_t *pGate;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Mio_Gate_t **ppG1;
  Mio_Gate_t *pGate_00;
  Mio_Pin_t *pMVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  
  iVar3 = Mio_LibraryReadGateNum(pLib);
  ppG1 = (Mio_Gate_t **)malloc((long)iVar3 << 3);
  iVar4 = Mio_LibraryHasProfile(pLib);
  if (iVar4 != 0) {
    puts("Mio_CollectRoots(): Using gate profile to select gates for mapping.");
  }
  pGate_00 = Mio_LibraryReadGates(pLib);
  if (pGate_00 == (Mio_Gate_t *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar2 = uVar8;
      if (((pGate_00->nInputs <= nInputs) &&
          ((((iVar4 == 0 || (iVar5 = Mio_GateReadProfile(pGate_00), iVar5 != 0)) ||
            (pGate_00->nInputs < 2)) && ((tDelay <= 0.0 || (pGate_00->dDelayMax <= (double)tDelay)))
           ))) && ((wVar1 = (pGate_00->field_15).uTruth, 1 < wVar1 + 1 &&
                   (((wVar1 != 0xaaaaaaaaaaaaaaaa && (fSkipInv == 0 || wVar1 != 0x5555555555555555))
                    && (pGate_00->pTwin == (Mio_Gate_t *)0x0)))))) {
        if (0 < (int)uVar8) {
          uVar7 = 0;
LAB_0040dcca:
          pGate = ppG1[uVar7];
          if ((pGate->field_15).uTruth != wVar1) goto code_r0x0040dcd4;
          if ((double)((float)pGate_00->dArea + 0.0094636) < pGate->dArea) goto LAB_0040dd53;
          if ((double)((float)pGate_00->dArea + -0.0094636) <= pGate->dArea) {
            pMVar6 = Mio_GateReadPins(pGate);
            fVar9 = 0.0;
            for (; pMVar6 != (Mio_Pin_t *)0x0; pMVar6 = Mio_PinReadNext(pMVar6)) {
              fVar9 = fVar9 + (float)(pMVar6->dDelayBlockRise * 0.5 + pMVar6->dDelayBlockFall * 0.5)
              ;
            }
            if (pGate->nInputs != 0) {
              fVar9 = fVar9 / (float)pGate->nInputs;
            }
            pMVar6 = Mio_GateReadPins(pGate_00);
            fVar10 = 0.0;
            for (; pMVar6 != (Mio_Pin_t *)0x0; pMVar6 = Mio_PinReadNext(pMVar6)) {
              fVar10 = fVar10 + (float)(pMVar6->dDelayBlockRise * 0.5 +
                                       pMVar6->dDelayBlockFall * 0.5);
            }
            if (pGate_00->nInputs != 0) {
              fVar10 = fVar10 / (float)pGate_00->nInputs;
            }
            if (fVar10 + 0.0094636 < fVar9) {
LAB_0040dd53:
              ppG1[uVar7] = pGate_00;
              goto LAB_0040dd74;
            }
            if (fVar10 + -0.0094636 <= fVar9) {
              iVar5 = strcmp(pGate->pName,pGate_00->pName);
              if (0 < iVar5) goto LAB_0040dd53;
              if (-1 < iVar5) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/mioUtils.c"
                              ,0x1fa,"int Mio_CompareTwoGates(Mio_Gate_t *, Mio_Gate_t *)");
              }
            }
          }
          goto LAB_0040dd74;
        }
LAB_0040dcdc:
        if (iVar3 <= (int)uVar8) {
          __assert_fail("iGate < nGates",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/mioUtils.c"
                        ,0x225,
                        "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)"
                       );
        }
        ppG1[(int)uVar8] = pGate_00;
        uVar2 = uVar8 + 1;
        if (fVerbose != 0) {
          printf("Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n",pGate_00->dArea,
                 pGate_00->dDelayMax,(ulong)(uVar8 + 2),pGate_00->pName,pGate_00->pOutName,
                 pGate_00->pForm);
        }
      }
LAB_0040dd74:
      uVar8 = uVar2;
      pGate_00 = Mio_GateReadNext(pGate_00);
    } while (pGate_00 != (Mio_Gate_t *)0x0);
    if (0 < (int)uVar8) {
      qsort(ppG1,(ulong)uVar8,8,Mio_DelayCompare);
      iVar3 = Mio_DelayCompare(ppG1,ppG1 + ((ulong)uVar8 - 1));
      if (0 < iVar3) {
        __assert_fail("Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/mioUtils.c"
                      ,0x230,
                      "Mio_Gate_t **Mio_CollectRoots(Mio_Library_t *, int, float, int, int *, int)")
        ;
      }
    }
  }
  if (pnGates != (int *)0x0) {
    *pnGates = uVar8;
  }
  return ppG1;
code_r0x0040dcd4:
  uVar7 = uVar7 + 1;
  if (uVar8 == uVar7) goto LAB_0040dcdc;
  goto LAB_0040dcca;
}

Assistant:

Mio_Gate_t ** Mio_CollectRoots( Mio_Library_t * pLib, int nInputs, float tDelay, int fSkipInv, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Gate_t ** ppGates;
    int i, nGates, iGate, fProfile;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppGates = ABC_ALLOC( Mio_Gate_t *, nGates );
    iGate = 0;
    // check if profile is entered
    fProfile = Mio_LibraryHasProfile( pLib );
    if ( fProfile )
        printf( "Mio_CollectRoots(): Using gate profile to select gates for mapping.\n" );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs )
            continue;
        if ( fProfile && Mio_GateReadProfile(pGate) == 0 && pGate->nInputs > 1 )
            continue;
        if ( tDelay > 0.0 && pGate->dDelayMax > (double)tDelay )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
            continue;
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) )
            continue;
        if ( pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) && fSkipInv )
            continue;
        if ( pGate->pTwin ) // skip multi-output gates for now
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iGate; i++ )
            if ( ppGates[i]->uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwoGates(ppGates[i], pGate) )
                    ppGates[i] = pGate;
                break;
            }
        if ( i < iGate )
            continue;
        assert( iGate < nGates );
        ppGates[ iGate++ ] = pGate;
        if ( fVerbose )
            printf( "Selected gate %3d:   %-20s  A = %7.2f  D = %7.2f  %3s = %-s\n", 
                iGate+1, pGate->pName, pGate->dArea, pGate->dDelayMax, pGate->pOutName, pGate->pForm );
    }
    // sort by delay
    if ( iGate > 0 ) 
    {
        qsort( (void *)ppGates, (size_t)iGate, sizeof(Mio_Gate_t *), 
                (int (*)(const void *, const void *)) Mio_DelayCompare );
        assert( Mio_DelayCompare( ppGates, ppGates + iGate - 1 ) <= 0 );
    }
    if ( pnGates )
        *pnGates = iGate;
    return ppGates;
}